

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O2

void __thiscall diy::MemoryBuffer::save_binary_blob(MemoryBuffer *this,char *x,size_t count)

{
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/serialization.hpp:563:32)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/serialization.hpp:563:32)>
             ::_M_manager;
  (*(this->super_BinaryBuffer)._vptr_BinaryBuffer[9])();
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return;
}

Assistant:

static void         save(BinaryBuffer& bb, const Vector& v)
    {
      size_t s = v.size();
      diy::save(bb, s);
      if (s > 0)
        diy::save(bb, &v[0], v.size());
    }